

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1c_vector_op.cpp
# Opt level: O0

void reverse(vector<int,_std::allocator<int>_> *v)

{
  size_type sVar1;
  reference __a;
  reference __b;
  undefined4 local_14;
  int i;
  vector<int,_std::allocator<int>_> *v_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(v);
    if (sVar1 >> 1 <= (ulong)(long)local_14) break;
    __a = std::vector<int,_std::allocator<int>_>::operator[](v,(long)local_14);
    sVar1 = std::vector<int,_std::allocator<int>_>::size(v);
    __b = std::vector<int,_std::allocator<int>_>::operator[](v,(sVar1 - 1) - (long)local_14);
    std::swap<int>(__a,__b);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void reverse(vector<int> &v) {
    for (int i = 0; i < v.size() / 2; i++) {
        swap(v[i], v[v.size() - 1 - i]);
    }
}